

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

void recall_tree_ns::init_tree(recall_tree *b)

{
  v_array<recall_tree_ns::node> *this;
  long in_RDI;
  uint32_t routers_used;
  uint32_t in_stack_00000078;
  uint32_t in_stack_0000007c;
  recall_tree *in_stack_00000080;
  node *in_stack_ffffffffffffff88;
  
  this = (v_array<recall_tree_ns::node> *)(in_RDI + 0x10);
  node::node((node *)0x2ece39);
  v_array<recall_tree_ns::node>::push_back(this,in_stack_ffffffffffffff88);
  init_tree(in_stack_00000080,in_stack_0000007c,in_stack_00000078,(uint32_t *)b);
  *(undefined8 *)(in_RDI + 0x38) = 0;
  return;
}

Assistant:

void init_tree(recall_tree& b)
{
  uint32_t routers_used = 0;

  b.nodes.push_back(node());
  init_tree(b, 0, 1, routers_used);
  b.max_routers = routers_used;
}